

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageBrushApply(gdImagePtr im,int x,int y)

{
  gdImageStruct *pgVar1;
  gdImagePtr pgVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int y_00;
  int iVar7;
  int iVar8;
  int iVar9;
  
  pgVar1 = im->brush;
  if (pgVar1 != (gdImageStruct *)0x0) {
    y_00 = pgVar1->sy / -2 + y;
    iVar6 = pgVar1->sy + y_00;
    iVar3 = pgVar1->sx / -2 + x;
    iVar7 = pgVar1->sx + iVar3;
    if (im->trueColor == 0) {
      iVar8 = 0;
      for (; y_00 < iVar6; y_00 = y_00 + 1) {
        for (iVar9 = 0; iVar3 + iVar9 < iVar7; iVar9 = iVar9 + 1) {
          pgVar2 = im->brush;
          uVar5 = gdImageGetPixel(pgVar2,iVar9,iVar8);
          if (uVar5 != pgVar2->transparent) {
            if (pgVar2->trueColor == 0) {
              iVar4 = im->brushColorMap[(int)uVar5];
            }
            else {
              iVar4 = gdImageColorResolveAlpha
                                (im,uVar5 >> 0x10 & 0xff,uVar5 >> 8 & 0xff,uVar5 & 0xff,
                                 uVar5 >> 0x18 & 0x7f);
            }
            gdImageSetPixel(im,iVar3 + iVar9,y_00,iVar4);
          }
        }
        iVar8 = iVar8 + 1;
      }
    }
    else if (pgVar1->trueColor == 0) {
      iVar8 = 0;
      for (; y_00 < iVar6; y_00 = y_00 + 1) {
        for (iVar9 = 0; iVar3 + iVar9 < iVar7; iVar9 = iVar9 + 1) {
          pgVar2 = im->brush;
          iVar4 = gdImageGetPixel(pgVar2,iVar9,iVar8);
          if (iVar4 != pgVar2->transparent) {
            iVar4 = gdImageGetTrueColorPixel(pgVar2,iVar9,iVar8);
            gdImageSetPixel(im,iVar3 + iVar9,y_00,iVar4);
          }
        }
        iVar8 = iVar8 + 1;
      }
    }
    else {
      iVar8 = 0;
      for (; y_00 < iVar6; y_00 = y_00 + 1) {
        for (iVar9 = 0; iVar3 + iVar9 < iVar7; iVar9 = iVar9 + 1) {
          pgVar2 = im->brush;
          iVar4 = gdImageGetTrueColorPixel(pgVar2,iVar9,iVar8);
          if (iVar4 != pgVar2->transparent) {
            gdImageSetPixel(im,iVar3 + iVar9,y_00,iVar4);
          }
        }
        iVar8 = iVar8 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
gdImageBrushApply (gdImagePtr im, int x, int y)
{
	int lx, ly;
	int hy;
	int hx;
	int x1, y1, x2, y2;
	int srcx, srcy;
	if (!im->brush) {
		return;
	}
	hy = gdImageSY (im->brush) / 2;
	y1 = y - hy;
	y2 = y1 + gdImageSY (im->brush);
	hx = gdImageSX (im->brush) / 2;
	x1 = x - hx;
	x2 = x1 + gdImageSX (im->brush);
	srcy = 0;
	if (im->trueColor) {
		if (im->brush->trueColor) {
			for (ly = y1; (ly < y2); ly++) {
				srcx = 0;
				for (lx = x1; (lx < x2); lx++) {
					int p;
					p = gdImageGetTrueColorPixel (im->brush, srcx, srcy);
					/* 2.0.9, Thomas Winzig: apply simple full transparency */
					if (p != gdImageGetTransparent (im->brush)) {
						gdImageSetPixel (im, lx, ly, p);
					}
					srcx++;
				}
				srcy++;
			}
		} else {
			/* 2.0.12: Brush palette, image truecolor (thanks to Thorben Kundinger
			   for pointing out the issue) */
			for (ly = y1; (ly < y2); ly++) {
				srcx = 0;
				for (lx = x1; (lx < x2); lx++) {
					int p, tc;
					p = gdImageGetPixel (im->brush, srcx, srcy);
					tc = gdImageGetTrueColorPixel (im->brush, srcx, srcy);
					/* 2.0.9, Thomas Winzig: apply simple full transparency */
					if (p != gdImageGetTransparent (im->brush)) {
						gdImageSetPixel (im, lx, ly, tc);
					}
					srcx++;
				}
				srcy++;
			}
		}
	} else {
		for (ly = y1; (ly < y2); ly++) {
			srcx = 0;
			for (lx = x1; (lx < x2); lx++) {
				int p;
				p = gdImageGetPixel (im->brush, srcx, srcy);
				/* Allow for non-square brushes! */
				if (p != gdImageGetTransparent (im->brush)) {
					/* Truecolor brush. Very slow
					   on a palette destination. */
					if (im->brush->trueColor) {
						gdImageSetPixel (im, lx, ly,
						                 gdImageColorResolveAlpha (im,
						                         gdTrueColorGetRed
						                         (p),
						                         gdTrueColorGetGreen
						                         (p),
						                         gdTrueColorGetBlue
						                         (p),
						                         gdTrueColorGetAlpha
						                         (p)));
					} else {
						gdImageSetPixel (im, lx, ly, im->brushColorMap[p]);
					}
				}
				srcx++;
			}
			srcy++;
		}
	}
}